

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool (anonymous_namespace)::readWaveform<float,short>
               (ifstream *fin,TWaveformT<short> *res,int32_t offset,streamsize size)

{
  short sVar1;
  float *pfVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  int in_EDX;
  vector<short,_std::allocator<short>_> *in_RSI;
  char *in_RDI;
  double dVar6;
  int i;
  double iamax;
  double amax;
  vector<float,_std::allocator<float>_> buf;
  TWaveformT<float> *in_stack_ffffffffffffff60;
  allocator_type *in_stack_ffffffffffffff70;
  vector<float,_std::allocator<float>_> *pvVar7;
  vector<float,_std::allocator<float>_> *this;
  size_type in_stack_ffffffffffffff78;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff80;
  int local_64;
  vector<float,_std::allocator<float>_> local_38;
  int local_14;
  vector<short,_std::allocator<short>_> *local_10;
  char *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<float>::allocator((allocator<float> *)0x143d76);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<float>::~allocator((allocator<float> *)0x143d96);
  std::vector<short,_std::allocator<short>_>::resize
            ((vector<short,_std::allocator<short>_> *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  pfVar2 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)0x143dd3);
  std::istream::read(local_8,(long)pfVar2);
  dVar6 = calcAbsMax<float>(in_stack_ffffffffffffff60);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    pvVar7 = (vector<float,_std::allocator<float>_> *)(1.0 / dVar6);
  }
  else {
    pvVar7 = (vector<float,_std::allocator<float>_> *)0x3ff0000000000000;
  }
  local_64 = 0;
  this = pvVar7;
  while( true ) {
    sVar3 = std::vector<float,_std::allocator<float>_>::size(&local_38);
    if ((int)sVar3 <= local_64) break;
    sVar1 = std::numeric_limits<short>::max();
    dVar6 = (double)(int)sVar1;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,(long)local_64);
    dVar6 = round(dVar6 * (double)*pvVar4 * (double)pvVar7);
    pvVar5 = std::vector<short,_std::allocator<short>_>::operator[]
                       (local_10,(long)(local_14 + local_64));
    *pvVar5 = (value_type)(int)dVar6;
    local_64 = local_64 + 1;
  }
  std::vector<float,_std::allocator<float>_>::~vector(this);
  return true;
}

Assistant:

bool readWaveform(std::ifstream & fin, TWaveformT<TSample> & res, int32_t offset, std::streamsize size) {
        if (std::is_same<TSample, TSampleI16>::value) {
            std::vector<TSampleInput> buf(size/sizeof(TSampleInput));
            res.resize(offset + size/sizeof(TSampleInput));
            fin.read((char *)(buf.data()), size);
            double amax = calcAbsMax(buf);
            double iamax = amax != 0.0 ? 1.0/amax : 1.0;
            for (auto i = 0; i < (int) buf.size(); ++i) res[offset + i] = std::round(std::numeric_limits<TSampleI16>::max()*(buf[i]*iamax));
        } else if (std::is_same<TSample, TSampleF>::value) {
            res.resize(offset + size/sizeof(TSample));
            fin.read((char *)(res.data() + offset), size);
        } else {
            return false;
        }
        return true;
    }